

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::Tree::remove_children(Tree *this,size_t node)

{
  size_t sVar1;
  code *pcVar2;
  Location LVar3;
  undefined1 auVar4 [24];
  Location LVar5;
  size_t sVar6;
  bool bVar7;
  size_t node_00;
  char msg [37];
  char local_b8 [36];
  uint uStack_94;
  size_t local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  char *pcStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  local_88 = node;
  if (node != 0xffffffffffffffff) {
    if (this->m_cap <= node) {
      if (((s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      local_b8[0] = '\0';
      local_b8[1] = '\0';
      local_b8[2] = '\0';
      local_b8[3] = '\0';
      local_b8[4] = '\0';
      local_b8[5] = '\0';
      local_b8[6] = '\0';
      local_b8[7] = '\0';
      local_b8[8] = 't';
      local_b8[9] = 'K';
      local_b8[10] = '\0';
      local_b8[0xb] = '\0';
      local_b8[0xc] = '\0';
      local_b8[0xd] = '\0';
      local_b8[0xe] = '\0';
      local_b8[0xf] = '\0';
      local_b8[0x10] = '\0';
      local_b8[0x11] = '\0';
      local_b8[0x12] = '\0';
      local_b8[0x13] = '\0';
      local_b8[0x14] = '\0';
      local_b8[0x15] = '\0';
      local_b8[0x16] = '\0';
      local_b8[0x17] = '\0';
      local_b8[0x18] = '\x1d';
      local_b8[0x19] = -0x59;
      local_b8[0x1a] = '$';
      local_b8[0x1b] = '\0';
      local_b8[0x1c] = '\0';
      local_b8[0x1d] = '\0';
      local_b8[0x1e] = '\0';
      local_b8[0x1f] = '\0';
      local_b8[0x20] = 'e';
      local_b8[0x21] = '\0';
      local_b8[0x22] = '\0';
      local_b8[0x23] = '\0';
      uStack_94 = 0;
      (*(code *)PTR_error_impl_0029b798)
                ("check failed: i >= 0 && i < m_cap",0x21,(anonymous_namespace)::s_default_callbacks
                );
    }
    if (this->m_buf != (NodeData *)0x0) goto LAB_0020a716;
  }
  builtin_strncpy(local_b8,"check failed: (get(node) != nullptr)",0x24);
  uStack_94 = uStack_94 & 0xffffff00;
  if (((s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
    pcVar2 = (code *)swi(3);
    (*pcVar2)();
    return;
  }
  local_58 = 0;
  uStack_50 = 0x657b;
  local_48 = 0;
  pcStack_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
  ;
  local_38 = 0x65;
  auVar4 = ZEXT1224(ZEXT412(0x657b) << 0x40);
  LVar3.name.str._0_4_ = 0x24a71d;
  LVar3.super_LineCol.offset = auVar4._0_8_;
  LVar3.super_LineCol.line = auVar4._8_8_;
  LVar3.super_LineCol.col = auVar4._16_8_;
  LVar3.name.str._4_4_ = 0;
  LVar3.name.len = 0x65;
  (*(this->m_callbacks).m_error)(local_b8,0x25,LVar3,(this->m_callbacks).m_user_data);
LAB_0020a716:
  if (this->m_cap <= local_88) {
    if (((s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    local_b8[0] = '\0';
    local_b8[1] = '\0';
    local_b8[2] = '\0';
    local_b8[3] = '\0';
    local_b8[4] = '\0';
    local_b8[5] = '\0';
    local_b8[6] = '\0';
    local_b8[7] = '\0';
    local_b8[8] = 't';
    local_b8[9] = 'K';
    local_b8[10] = '\0';
    local_b8[0xb] = '\0';
    local_b8[0xc] = '\0';
    local_b8[0xd] = '\0';
    local_b8[0xe] = '\0';
    local_b8[0xf] = '\0';
    local_b8[0x10] = '\0';
    local_b8[0x11] = '\0';
    local_b8[0x12] = '\0';
    local_b8[0x13] = '\0';
    local_b8[0x14] = '\0';
    local_b8[0x15] = '\0';
    local_b8[0x16] = '\0';
    local_b8[0x17] = '\0';
    local_b8[0x18] = '\x1d';
    local_b8[0x19] = -0x59;
    local_b8[0x1a] = '$';
    local_b8[0x1b] = '\0';
    local_b8[0x1c] = '\0';
    local_b8[0x1d] = '\0';
    local_b8[0x1e] = '\0';
    local_b8[0x1f] = '\0';
    local_b8[0x20] = 'e';
    local_b8[0x21] = '\0';
    local_b8[0x22] = '\0';
    local_b8[0x23] = '\0';
    uStack_94 = 0;
    (*(code *)PTR_error_impl_0029b798)
              ("check failed: i >= 0 && i < m_cap",0x21,(anonymous_namespace)::s_default_callbacks);
  }
  sVar6 = local_88;
  node_00 = this->m_buf[local_88].m_first_child;
  do {
    if (node_00 == 0xffffffffffffffff) {
      return;
    }
    remove_children(this,node_00);
    if (this->m_cap <= node_00) {
      if (((s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      local_b8[0] = '\0';
      local_b8[1] = '\0';
      local_b8[2] = '\0';
      local_b8[3] = '\0';
      local_b8[4] = '\0';
      local_b8[5] = '\0';
      local_b8[6] = '\0';
      local_b8[7] = '\0';
      local_b8[8] = 't';
      local_b8[9] = 'K';
      local_b8[10] = '\0';
      local_b8[0xb] = '\0';
      local_b8[0xc] = '\0';
      local_b8[0xd] = '\0';
      local_b8[0xe] = '\0';
      local_b8[0xf] = '\0';
      local_b8[0x10] = '\0';
      local_b8[0x11] = '\0';
      local_b8[0x12] = '\0';
      local_b8[0x13] = '\0';
      local_b8[0x14] = '\0';
      local_b8[0x15] = '\0';
      local_b8[0x16] = '\0';
      local_b8[0x17] = '\0';
      local_b8[0x18] = '\x1d';
      local_b8[0x19] = -0x59;
      local_b8[0x1a] = '$';
      local_b8[0x1b] = '\0';
      local_b8[0x1c] = '\0';
      local_b8[0x1d] = '\0';
      local_b8[0x1e] = '\0';
      local_b8[0x1f] = '\0';
      local_b8[0x20] = 'e';
      local_b8[0x21] = '\0';
      local_b8[0x22] = '\0';
      local_b8[0x23] = '\0';
      uStack_94 = 0;
      (*(code *)PTR_error_impl_0029b798)
                ("check failed: i >= 0 && i < m_cap",0x21,(anonymous_namespace)::s_default_callbacks
                );
    }
    if (this->m_buf == (NodeData *)0x0) {
      builtin_strncpy(local_b8,"check failed: (get(ich) != nullptr)",0x24);
      if (((s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      local_80 = 0;
      uStack_78 = 0x6580;
      local_70 = 0;
      pcStack_68 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_60 = 0x65;
      auVar4 = ZEXT1224(ZEXT412(0x6580) << 0x40);
      LVar5.name.str._0_4_ = 0x24a71d;
      LVar5.super_LineCol.offset = auVar4._0_8_;
      LVar5.super_LineCol.line = auVar4._8_8_;
      LVar5.super_LineCol.col = auVar4._16_8_;
      LVar5.name.str._4_4_ = 0;
      LVar5.name.len = 0x65;
      (*(this->m_callbacks).m_error)(local_b8,0x24,LVar5,(this->m_callbacks).m_user_data);
    }
    if (this->m_cap <= node_00) {
      if (((s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      local_b8[0] = '\0';
      local_b8[1] = '\0';
      local_b8[2] = '\0';
      local_b8[3] = '\0';
      local_b8[4] = '\0';
      local_b8[5] = '\0';
      local_b8[6] = '\0';
      local_b8[7] = '\0';
      local_b8[8] = 't';
      local_b8[9] = 'K';
      local_b8[10] = '\0';
      local_b8[0xb] = '\0';
      local_b8[0xc] = '\0';
      local_b8[0xd] = '\0';
      local_b8[0xe] = '\0';
      local_b8[0xf] = '\0';
      local_b8[0x10] = '\0';
      local_b8[0x11] = '\0';
      local_b8[0x12] = '\0';
      local_b8[0x13] = '\0';
      local_b8[0x14] = '\0';
      local_b8[0x15] = '\0';
      local_b8[0x16] = '\0';
      local_b8[0x17] = '\0';
      local_b8[0x18] = '\x1d';
      local_b8[0x19] = -0x59;
      local_b8[0x1a] = '$';
      local_b8[0x1b] = '\0';
      local_b8[0x1c] = '\0';
      local_b8[0x1d] = '\0';
      local_b8[0x1e] = '\0';
      local_b8[0x1f] = '\0';
      local_b8[0x20] = 'e';
      local_b8[0x21] = '\0';
      local_b8[0x22] = '\0';
      local_b8[0x23] = '\0';
      uStack_94 = 0;
      (*(code *)PTR_error_impl_0029b798)
                ("check failed: i >= 0 && i < m_cap",0x21,(anonymous_namespace)::s_default_callbacks
                );
    }
    sVar1 = this->m_buf[node_00].m_next_sibling;
    _release(this,node_00);
    if (this->m_cap <= local_88) {
      if (((s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      local_b8[0] = '\0';
      local_b8[1] = '\0';
      local_b8[2] = '\0';
      local_b8[3] = '\0';
      local_b8[4] = '\0';
      local_b8[5] = '\0';
      local_b8[6] = '\0';
      local_b8[7] = '\0';
      local_b8[8] = 't';
      local_b8[9] = 'K';
      local_b8[10] = '\0';
      local_b8[0xb] = '\0';
      local_b8[0xc] = '\0';
      local_b8[0xd] = '\0';
      local_b8[0xe] = '\0';
      local_b8[0xf] = '\0';
      local_b8[0x10] = '\0';
      local_b8[0x11] = '\0';
      local_b8[0x12] = '\0';
      local_b8[0x13] = '\0';
      local_b8[0x14] = '\0';
      local_b8[0x15] = '\0';
      local_b8[0x16] = '\0';
      local_b8[0x17] = '\0';
      local_b8[0x18] = '\x1d';
      local_b8[0x19] = -0x59;
      local_b8[0x1a] = '$';
      local_b8[0x1b] = '\0';
      local_b8[0x1c] = '\0';
      local_b8[0x1d] = '\0';
      local_b8[0x1e] = '\0';
      local_b8[0x1f] = '\0';
      local_b8[0x20] = 'e';
      local_b8[0x21] = '\0';
      local_b8[0x22] = '\0';
      local_b8[0x23] = '\0';
      uStack_94 = 0;
      (*(code *)PTR_error_impl_0029b798)
                ("check failed: i >= 0 && i < m_cap",0x21,(anonymous_namespace)::s_default_callbacks
                );
    }
    bVar7 = node_00 == this->m_buf[sVar6].m_last_child;
    node_00 = sVar1;
    if (bVar7) {
      return;
    }
  } while( true );
}

Assistant:

void Tree::remove_children(size_t node)
{
    _RYML_CB_ASSERT(m_callbacks, get(node) != nullptr);
    size_t ich = get(node)->m_first_child;
    while(ich != NONE)
    {
        remove_children(ich);
        _RYML_CB_ASSERT(m_callbacks, get(ich) != nullptr);
        size_t next = get(ich)->m_next_sibling;
        _release(ich);
        if(ich == get(node)->m_last_child)
            break;
        ich = next;
    }
}